

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

char8_t * fmt::v8::detail::
          parse_precision<char8_t,fmt::v8::detail::specs_checker<fmt::v8::detail::dynamic_specs_handler<fmt::v8::basic_format_parse_context<char8_t,fmt::v8::detail::error_handler>>>&>
                    (char8_t *begin,char8_t *end,
                    specs_checker<fmt::v8::detail::dynamic_specs_handler<fmt::v8::basic_format_parse_context<char8_t,_fmt::v8::detail::error_handler>_>_>
                    *handler)

{
  basic_format_parse_context<char8_t,_fmt::v8::detail::error_handler> *pbVar1;
  dynamic_format_specs<char8_t> *pdVar2;
  int iVar3;
  char8_t *begin_00;
  byte *local_20;
  precision_adapter local_18;
  
  local_20 = (byte *)(begin + 1);
  if (local_20 != (byte *)end) {
    if (*local_20 - 0x30 < 10) {
      iVar3 = parse_nonnegative_int<char8_t>((char8_t **)&local_20,end,-1);
      if (iVar3 == -1) {
        fmt::v8::detail::throw_format_error("number is too big");
      }
      ((handler->
       super_dynamic_specs_handler<fmt::v8::basic_format_parse_context<char8_t,_fmt::v8::detail::error_handler>_>
       ).super_specs_setter<char8_t>.specs_)->precision = iVar3;
    }
    else {
      if (*local_20 != 0x7b) goto LAB_00110e14;
      begin_00 = begin + 2;
      if (begin_00 != end) {
        local_18.handler = handler;
        if ((*begin_00 == ':') || (*begin_00 == '}')) {
          pbVar1 = (handler->
                   super_dynamic_specs_handler<fmt::v8::basic_format_parse_context<char8_t,_fmt::v8::detail::error_handler>_>
                   ).context_;
          iVar3 = pbVar1->next_arg_id_;
          if (iVar3 < 0) {
            fmt::v8::detail::throw_format_error
                      ("cannot switch from manual to automatic argument indexing");
          }
          pbVar1->next_arg_id_ = iVar3 + 1;
          pdVar2 = (handler->
                   super_dynamic_specs_handler<fmt::v8::basic_format_parse_context<char8_t,_fmt::v8::detail::error_handler>_>
                   ).specs_;
          (pdVar2->precision_ref).kind = index;
          (pdVar2->precision_ref).val.index = iVar3;
        }
        else {
          begin_00 = do_parse_arg_id<char8_t,fmt::v8::detail::parse_precision<char8_t,fmt::v8::detail::specs_checker<fmt::v8::detail::dynamic_specs_handler<fmt::v8::basic_format_parse_context<char8_t,fmt::v8::detail::error_handler>>>&>(char8_t_const*,char8_t_const*,fmt::v8::detail::specs_checker<fmt::v8::detail::dynamic_specs_handler<fmt::v8::basic_format_parse_context<char8_t,fmt::v8::detail::error_handler>>>&)::precision_adapter&>
                               (begin_00,end,&local_18);
        }
      }
      if ((begin_00 == end) || (local_20 = (byte *)(begin_00 + 1), *begin_00 != '}')) {
        fmt::v8::detail::throw_format_error("invalid format string");
      }
    }
    if ((handler->arg_type_ < custom_type) && ((0x41feU >> (handler->arg_type_ & 0x1f) & 1) != 0)) {
      fmt::v8::detail::throw_format_error("precision not allowed for this argument type");
    }
    return (char8_t *)local_20;
  }
LAB_00110e14:
  fmt::v8::detail::throw_format_error("missing precision specifier");
}

Assistant:

FMT_CONSTEXPR auto parse_precision(const Char* begin, const Char* end,
                                   Handler&& handler) -> const Char* {
  using detail::auto_id;
  struct precision_adapter {
    Handler& handler;

    FMT_CONSTEXPR void operator()() { handler.on_dynamic_precision(auto_id()); }
    FMT_CONSTEXPR void operator()(int id) { handler.on_dynamic_precision(id); }
    FMT_CONSTEXPR void operator()(basic_string_view<Char> id) {
      handler.on_dynamic_precision(id);
    }
    FMT_CONSTEXPR void on_error(const char* message) {
      if (message) handler.on_error(message);
    }
  };

  ++begin;
  auto c = begin != end ? *begin : Char();
  if ('0' <= c && c <= '9') {
    auto precision = parse_nonnegative_int(begin, end, -1);
    if (precision != -1)
      handler.on_precision(precision);
    else
      handler.on_error("number is too big");
  } else if (c == '{') {
    ++begin;
    if (begin != end)
      begin = parse_arg_id(begin, end, precision_adapter{handler});
    if (begin == end || *begin++ != '}')
      return handler.on_error("invalid format string"), begin;
  } else {
    return handler.on_error("missing precision specifier"), begin;
  }
  handler.end_precision();
  return begin;
}